

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_cookie_freelist(Cookie *co,_Bool cookiestoo)

{
  Cookie *pCVar1;
  
  if (co != (Cookie *)0x0) {
    do {
      pCVar1 = co->next;
      if (cookiestoo) {
        freecookie(co);
      }
      else {
        (*Curl_cfree)(co);
      }
      co = pCVar1;
    } while (pCVar1 != (Cookie *)0x0);
  }
  return;
}

Assistant:

void Curl_cookie_freelist(struct Cookie *co, bool cookiestoo)
{
  struct Cookie *next;
  if(co) {
    while(co) {
      next = co->next;
      if(cookiestoo)
        freecookie(co);
      else
        free(co); /* we only free the struct since the "members" are all just
                     pointed out in the main cookie list! */
      co = next;
    }
  }
}